

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialVector * RigidBodyDynamics::Math::crossm(SpatialVector *v1,SpatialVector *v2)

{
  double dVar1;
  CoeffReturnType pdVar2;
  double *v4;
  SpatialVector *in_RDI;
  double *v1_00;
  SpatialVector_t *this;
  Index in_stack_fffffffffffffea8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *in_stack_fffffffffffffeb0;
  double *v3;
  double *v2_00;
  double *v0;
  double *v5;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v4 = (double *)((ulong)*pdVar2 ^ 0x8000000000000000);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v3 = (double *)*pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v1_00 = (double *)((double)v4 * (double)v3 + dVar1 * *pdVar2);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v2_00 = (double *)*pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  this = (SpatialVector_t *)(-(double)v2_00 * *pdVar2 + (double)v1_00);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v0 = (double *)*pdVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v5 = (double *)*pdVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  SpatialVector_t::SpatialVector_t(this,v0,v1_00,v2_00,v3,v4,v5);
  return in_RDI;
}

Assistant:

inline SpatialVector crossm (const SpatialVector &v1, const SpatialVector &v2) {
  return SpatialVector (
      -v1[2] * v2[1] + v1[1] * v2[2],
      v1[2] * v2[0] - v1[0] * v2[2],
      -v1[1] * v2[0] + v1[0] * v2[1],
      -v1[5] * v2[1] + v1[4] * v2[2] - v1[2] * v2[4] + v1[1] * v2[5],
      v1[5] * v2[0] - v1[3] * v2[2] + v1[2] * v2[3] - v1[0] * v2[5],
      -v1[4] * v2[0] + v1[3] * v2[1] - v1[1] * v2[3] + v1[0] * v2[4]
      );
}